

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::extractInstructionsFromCalls
          (InvocationInterlockPlacementPass *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *blocks)

{
  BasicBlock *pBVar1;
  char cVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  pointer ppBVar5;
  bool modified;
  undefined1 local_91;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  _Any_data *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  pointer local_40;
  InvocationInterlockPlacementPass *local_38;
  
  local_91 = 0;
  ppBVar5 = (blocks->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (blocks->
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar5 != local_40) {
    local_38 = this;
    do {
      pBVar1 = *ppBVar5;
      local_68._M_unused._M_object = local_38;
      local_68._8_8_ = &local_91;
      pcStack_50 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
                 ::_M_manager;
      uStack_80 = 0;
      pcStack_70 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                 ::_M_manager;
      pIVar3 = (pBVar1->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      local_88 = &local_68;
      if (pIVar3 != (Instruction *)0x0) {
        local_90._M_head_impl = pIVar3;
        std::
        _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
        ::_M_invoke(&local_68,&local_90._M_head_impl);
      }
      pIVar3 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar3 != (Instruction *)0x0) &&
         ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        do {
          if (pIVar3 == (Instruction *)0x0) break;
          pIVar4 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          local_90._M_head_impl = pIVar3;
          if (local_78 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
            pIVar4 = (Instruction *)0x0;
          }
          cVar2 = (*pcStack_70)(&local_88,&local_90);
          pIVar3 = pIVar4;
        } while (cVar2 != '\0');
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,3);
      }
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      ppBVar5 = ppBVar5 + 1;
    } while (ppBVar5 != local_40);
  }
  return (bool)local_91;
}

Assistant:

bool InvocationInterlockPlacementPass::extractInstructionsFromCalls(
    std::vector<BasicBlock*> blocks) {
  bool modified = false;

  for (BasicBlock* block : blocks) {
    block->ForEachInst([this, &modified](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        uint32_t function_id =
            inst->GetSingleWordInOperand(kFunctionCallFunctionIdInIdx);
        Function* func = context()->GetFunction(function_id);
        ExtractionResult result = extracted_functions_[func];

        if (result.had_begin) {
          Instruction* new_inst = new Instruction(
              context(), spv::Op::OpBeginInvocationInterlockEXT);
          new_inst->InsertBefore(inst);
          modified = true;
        }
        if (result.had_end) {
          Instruction* new_inst =
              new Instruction(context(), spv::Op::OpEndInvocationInterlockEXT);
          new_inst->InsertAfter(inst);
          modified = true;
        }
      }
    });
  }
  return modified;
}